

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O1

Abbrev * __thiscall bloaty::dwarf::DIEReader::ReadCode(DIEReader *this,CU *cu)

{
  char *pcVar1;
  bool bVar2;
  uint code;
  Abbrev *in_RAX;
  size_t sVar3;
  int iVar4;
  Abbrev *ret;
  Abbrev *local_18;
  
  sVar3 = (this->remaining_)._M_len;
  if (sVar3 != 0) {
    iVar4 = this->depth_;
    pcVar1 = (this->remaining_)._M_str;
    do {
      iVar4 = iVar4 + -1;
      sVar3 = sVar3 - 1;
      if (*pcVar1 != '\0') break;
      (this->remaining_)._M_str = pcVar1 + 1;
      (this->remaining_)._M_len = sVar3;
      this->depth_ = iVar4;
      pcVar1 = pcVar1 + 1;
    } while (sVar3 != 0);
  }
  if ((this->remaining_)._M_len == 0) {
    local_18 = (Abbrev *)0x0;
  }
  else {
    local_18 = in_RAX;
    code = ReadLEB128<unsigned_int>(&this->remaining_);
    bVar2 = AbbrevTable::GetAbbrev(cu->unit_abbrev_,code,&local_18);
    if (!bVar2) {
      Throw("couldn\'t find abbreviation for code",0x10a);
    }
    if (local_18->has_child == true) {
      this->depth_ = this->depth_ + 1;
    }
  }
  return local_18;
}

Assistant:

const AbbrevTable::Abbrev* DIEReader::ReadCode(const CU& cu) {
  SkipNullEntries();
  if (remaining_.empty()) {
    return nullptr;
  }
  uint32_t code = ReadLEB128<uint32_t>(&remaining_);
  const AbbrevTable::Abbrev* ret;
  if (!cu.unit_abbrev_->GetAbbrev(code, &ret)) {
    THROW("couldn't find abbreviation for code");
  }
  if (ret->has_child) {
    depth_++;
  }
  return ret;
}